

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O1

void __thiscall
amrex::YAFluxRegister::FineAdd
          (YAFluxRegister *this,MFIter *mfi,array<const_amrex::FArrayBox_*,_3UL> *a_flux,Real *dx,
          Real dt,RunOn runon)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint N;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  pointer pVVar10;
  double *pdVar11;
  double *pdVar12;
  double dVar13;
  undefined1 auVar14 [16];
  Box bx_00;
  uint uVar15;
  pointer ppFVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int *piVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  uint uVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  int idim;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  BaseFab<double> *pBVar53;
  ulong uVar54;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar55;
  undefined1 auVar56 [16];
  Box result;
  IntVect hi;
  Box bx;
  array<amrex::FArrayBox,_3UL> ftmp;
  undefined1 auVar57 [12];
  long local_318;
  long local_300;
  ulong local_2f0;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_290;
  uint local_288;
  uint uStack_284;
  uint local_280;
  uint local_27c [5];
  ulong local_268;
  undefined8 local_260;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  uint local_248;
  uint local_244;
  uint local_240;
  int local_23c;
  long local_238;
  double *local_230;
  Box local_228;
  undefined1 local_208 [16];
  uint local_1f4;
  long local_1f0;
  uint local_1e8;
  int local_1e4;
  uint local_1e0;
  uint local_1dc;
  int local_1d8;
  uint local_1d4;
  uint local_1d0;
  int local_1cc;
  ulong local_1c8;
  pointer local_1c0;
  FArrayBox *local_1b8;
  pointer local_1b0;
  FArrayBox *local_1a8;
  Box local_19c;
  ulong local_180;
  long local_178;
  double *local_170;
  double *local_168;
  pointer local_160;
  ulong local_158;
  uint local_150;
  FArrayBox *local_148 [4];
  undefined1 local_128 [16];
  double local_118;
  BaseFab<double> local_108 [3];
  
  piVar25 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar25 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar25;
  }
  iVar20 = *piVar25;
  pVVar10 = (this->m_cfp_fab).
            super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       &pVVar10[iVar20].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
        super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> ==
      *(pointer *)
       ((long)&pVVar10[iVar20].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
               .super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> + 8)) {
    return;
  }
  local_208._8_4_ = in_XMM0_Dc;
  local_208._0_8_ = dt;
  local_208._12_4_ = in_XMM0_Dd;
  MFIter::tilebox(&local_19c,mfi);
  local_288 = local_19c.smallend.vect[0];
  uStack_284 = local_19c.smallend.vect[1];
  local_27c[2] = local_19c.bigend.vect[2];
  local_27c[1] = local_19c.bigend.vect[1];
  local_280 = local_19c.smallend.vect[2];
  local_27c[0] = local_19c.bigend.vect[0];
  uVar2 = (this->m_ratio).vect[0];
  uVar52 = (ulong)uVar2;
  uVar3 = (this->m_ratio).vect[1];
  uVar50 = (ulong)uVar3;
  if ((uVar3 == 1 && uVar2 == 1) && ((this->m_ratio).vect[2] == 1)) goto LAB_00756a83;
  if (uVar52 != 1) {
    if (uVar2 == 4) {
      if (local_19c.smallend.vect[0] < 0) {
        uVar18 = local_19c.smallend.vect[0] + 1;
        local_288 = -uVar18;
        if (0 < (int)uVar18) {
          local_288 = uVar18;
        }
        local_288 = local_288 >> 2;
LAB_00756658:
        local_288 = ~local_288;
      }
      else {
        local_288 = (uint)local_19c.smallend.vect[0] >> 2;
      }
    }
    else if (uVar2 == 2) {
      if (local_19c.smallend.vect[0] < 0) {
        uVar18 = local_19c.smallend.vect[0] + 1;
        local_288 = -uVar18;
        if (0 < (int)uVar18) {
          local_288 = uVar18;
        }
        local_288 = local_288 >> 1;
        goto LAB_00756658;
      }
      local_288 = (uint)local_19c.smallend.vect[0] >> 1;
    }
    else if (local_19c.smallend.vect[0] < 0) {
      iVar17 = local_19c.smallend.vect[0] + 1;
      iVar4 = -iVar17;
      if (0 < iVar17) {
        iVar4 = iVar17;
      }
      local_288 = ~(iVar4 / (int)uVar2);
    }
    else {
      local_288 = local_19c.smallend.vect[0] / (int)uVar2;
    }
  }
  if (uVar50 != 1) {
    if (uVar3 == 4) {
      if (local_19c.smallend.vect[1] < 0) {
        uVar18 = local_19c.smallend.vect[1] + 1;
        uStack_284 = -uVar18;
        if (0 < (int)uVar18) {
          uStack_284 = uVar18;
        }
        uStack_284 = uStack_284 >> 2;
LAB_007566c3:
        uStack_284 = ~uStack_284;
      }
      else {
        uStack_284 = (uint)local_19c.smallend.vect[1] >> 2;
      }
    }
    else if (uVar3 == 2) {
      if (local_19c.smallend.vect[1] < 0) {
        uVar18 = local_19c.smallend.vect[1] + 1;
        uStack_284 = -uVar18;
        if (0 < (int)uVar18) {
          uStack_284 = uVar18;
        }
        uStack_284 = uStack_284 >> 1;
        goto LAB_007566c3;
      }
      uStack_284 = (uint)local_19c.smallend.vect[1] >> 1;
    }
    else if (local_19c.smallend.vect[1] < 0) {
      iVar17 = local_19c.smallend.vect[1] + 1;
      iVar4 = -iVar17;
      if (0 < iVar17) {
        iVar4 = iVar17;
      }
      uStack_284 = ~(iVar4 / (int)uVar3);
    }
    else {
      uStack_284 = local_19c.smallend.vect[1] / (int)uVar3;
    }
  }
  iVar4 = (this->m_ratio).vect[2];
  if (iVar4 != 1) {
    if (iVar4 == 4) {
      if (local_19c.smallend.vect[2] < 0) {
        uVar18 = local_19c.smallend.vect[2] + 1;
        local_280 = -uVar18;
        if (0 < (int)uVar18) {
          local_280 = uVar18;
        }
        local_280 = local_280 >> 2;
LAB_00756736:
        local_280 = ~local_280;
      }
      else {
        local_280 = (uint)local_19c.smallend.vect[2] >> 2;
      }
    }
    else if (iVar4 == 2) {
      if (local_19c.smallend.vect[2] < 0) {
        uVar18 = local_19c.smallend.vect[2] + 1;
        local_280 = -uVar18;
        if (0 < (int)uVar18) {
          local_280 = uVar18;
        }
        local_280 = local_280 >> 1;
        goto LAB_00756736;
      }
      local_280 = (uint)local_19c.smallend.vect[2] >> 1;
    }
    else if (local_19c.smallend.vect[2] < 0) {
      iVar19 = local_19c.smallend.vect[2] + 1;
      iVar17 = -iVar19;
      if (0 < iVar19) {
        iVar17 = iVar19;
      }
      local_280 = ~(iVar17 / iVar4);
    }
    else {
      local_280 = local_19c.smallend.vect[2] / iVar4;
    }
  }
  if (local_19c.btype.itype == 0) {
    if (uVar52 != 1) {
      if (uVar2 == 4) {
        if (local_19c.bigend.vect[0] < 0) {
          uVar18 = local_19c.bigend.vect[0] + 1;
          local_27c[0] = -uVar18;
          if (0 < (int)uVar18) {
            local_27c[0] = uVar18;
          }
          local_27c[0] = local_27c[0] >> 2;
LAB_00756983:
          local_27c[0] = ~local_27c[0];
        }
        else {
          local_27c[0] = (uint)local_19c.bigend.vect[0] >> 2;
        }
      }
      else if (uVar2 == 2) {
        if (local_19c.bigend.vect[0] < 0) {
          uVar18 = local_19c.bigend.vect[0] + 1;
          local_27c[0] = -uVar18;
          if (0 < (int)uVar18) {
            local_27c[0] = uVar18;
          }
          local_27c[0] = local_27c[0] >> 1;
          goto LAB_00756983;
        }
        local_27c[0] = (uint)local_19c.bigend.vect[0] >> 1;
      }
      else if (local_19c.bigend.vect[0] < 0) {
        iVar19 = local_19c.bigend.vect[0] + 1;
        iVar17 = -iVar19;
        if (0 < iVar19) {
          iVar17 = iVar19;
        }
        local_27c[0] = ~(iVar17 / (int)uVar2);
      }
      else {
        local_27c[0] = local_19c.bigend.vect[0] / (int)uVar2;
      }
    }
    if (uVar50 != 1) {
      if (uVar3 == 4) {
        if (local_19c.bigend.vect[1] < 0) {
          uVar18 = local_19c.bigend.vect[1] + 1;
          local_27c[1] = -uVar18;
          if (0 < (int)uVar18) {
            local_27c[1] = uVar18;
          }
          local_27c[1] = local_27c[1] >> 2;
LAB_007569f2:
          local_27c[1] = ~local_27c[1];
        }
        else {
          local_27c[1] = (uint)local_19c.bigend.vect[1] >> 2;
        }
      }
      else if (uVar3 == 2) {
        if (local_19c.bigend.vect[1] < 0) {
          uVar18 = local_19c.bigend.vect[1] + 1;
          local_27c[1] = -uVar18;
          if (0 < (int)uVar18) {
            local_27c[1] = uVar18;
          }
          local_27c[1] = local_27c[1] >> 1;
          goto LAB_007569f2;
        }
        local_27c[1] = (uint)local_19c.bigend.vect[1] >> 1;
      }
      else if (local_19c.bigend.vect[1] < 0) {
        iVar19 = local_19c.bigend.vect[1] + 1;
        iVar17 = -iVar19;
        if (0 < iVar19) {
          iVar17 = iVar19;
        }
        local_27c[1] = ~(iVar17 / (int)uVar3);
      }
      else {
        local_27c[1] = local_19c.bigend.vect[1] / (int)uVar3;
      }
    }
    if (iVar4 == 1) goto LAB_00756a83;
    if (iVar4 == 4) {
      if (-1 < local_19c.bigend.vect[2]) {
        local_27c[2] = (uint)local_19c.bigend.vect[2] >> 2;
        goto LAB_00756a83;
      }
      uVar18 = local_19c.bigend.vect[2] + 1;
      local_27c[2] = -uVar18;
      if (0 < (int)uVar18) {
        local_27c[2] = uVar18;
      }
      local_27c[2] = local_27c[2] >> 2;
    }
    else {
      if (iVar4 != 2) {
        if (local_19c.bigend.vect[2] < 0) {
          iVar19 = local_19c.bigend.vect[2] + 1;
          iVar17 = -iVar19;
          if (0 < iVar19) {
            iVar17 = iVar19;
          }
          local_27c[2] = ~(iVar17 / iVar4);
        }
        else {
          local_27c[2] = local_19c.bigend.vect[2] / iVar4;
        }
        goto LAB_00756a83;
      }
      if (-1 < local_19c.bigend.vect[2]) {
        local_27c[2] = (uint)local_19c.bigend.vect[2] >> 1;
        goto LAB_00756a83;
      }
      uVar18 = local_19c.bigend.vect[2] + 1;
      local_27c[2] = -uVar18;
      if (0 < (int)uVar18) {
        local_27c[2] = uVar18;
      }
      local_27c[2] = local_27c[2] >> 1;
    }
    local_27c[2] = ~local_27c[2];
    goto LAB_00756a83;
  }
  local_108[0]._vptr_BaseFab = (_func_int **)0x0;
  local_108[0].super_DataAllocator.m_arena._0_4_ = 0;
  lVar45 = 0;
  do {
    if (((local_19c.btype.itype >> ((uint)lVar45 & 0x1f) & 1) != 0) &&
       ((int)local_27c[lVar45] % (this->m_ratio).vect[lVar45] != 0)) {
      *(undefined4 *)((long)(&local_108[0].domain.smallend + -2) + lVar45 * 4) = 1;
    }
    lVar45 = lVar45 + 1;
  } while (lVar45 != 3);
  if (uVar52 != 1) {
    if (uVar2 == 4) {
      if (local_19c.bigend.vect[0] < 0) {
        uVar18 = local_19c.bigend.vect[0] + 1;
        local_27c[0] = -uVar18;
        if (0 < (int)uVar18) {
          local_27c[0] = uVar18;
        }
        local_27c[0] = local_27c[0] >> 2;
LAB_0075684a:
        local_27c[0] = ~local_27c[0];
      }
      else {
        local_27c[0] = (uint)local_19c.bigend.vect[0] >> 2;
      }
    }
    else if (uVar2 == 2) {
      if (local_19c.bigend.vect[0] < 0) {
        uVar18 = local_19c.bigend.vect[0] + 1;
        local_27c[0] = -uVar18;
        if (0 < (int)uVar18) {
          local_27c[0] = uVar18;
        }
        local_27c[0] = local_27c[0] >> 1;
        goto LAB_0075684a;
      }
      local_27c[0] = (uint)local_19c.bigend.vect[0] >> 1;
    }
    else if (local_19c.bigend.vect[0] < 0) {
      iVar19 = local_19c.bigend.vect[0] + 1;
      iVar17 = -iVar19;
      if (0 < iVar19) {
        iVar17 = iVar19;
      }
      local_27c[0] = ~(iVar17 / (int)uVar2);
    }
    else {
      local_27c[0] = local_19c.bigend.vect[0] / (int)uVar2;
    }
  }
  if (uVar50 != 1) {
    if (uVar3 == 4) {
      if (local_19c.bigend.vect[1] < 0) {
        uVar18 = local_19c.bigend.vect[1] + 1;
        local_27c[1] = -uVar18;
        if (0 < (int)uVar18) {
          local_27c[1] = uVar18;
        }
        local_27c[1] = local_27c[1] >> 2;
LAB_007568b7:
        local_27c[1] = ~local_27c[1];
      }
      else {
        local_27c[1] = (uint)local_19c.bigend.vect[1] >> 2;
      }
    }
    else if (uVar3 == 2) {
      if (local_19c.bigend.vect[1] < 0) {
        uVar18 = local_19c.bigend.vect[1] + 1;
        local_27c[1] = -uVar18;
        if (0 < (int)uVar18) {
          local_27c[1] = uVar18;
        }
        local_27c[1] = local_27c[1] >> 1;
        goto LAB_007568b7;
      }
      local_27c[1] = (uint)local_19c.bigend.vect[1] >> 1;
    }
    else if (local_19c.bigend.vect[1] < 0) {
      iVar19 = local_19c.bigend.vect[1] + 1;
      iVar17 = -iVar19;
      if (0 < iVar19) {
        iVar17 = iVar19;
      }
      local_27c[1] = ~(iVar17 / (int)uVar3);
    }
    else {
      local_27c[1] = local_19c.bigend.vect[1] / (int)uVar3;
    }
  }
  if (iVar4 != 1) {
    if (iVar4 == 4) {
      if (local_19c.bigend.vect[2] < 0) {
        uVar18 = local_19c.bigend.vect[2] + 1;
        local_27c[2] = -uVar18;
        if (0 < (int)uVar18) {
          local_27c[2] = uVar18;
        }
        local_27c[2] = local_27c[2] >> 2;
LAB_00756922:
        local_27c[2] = ~local_27c[2];
      }
      else {
        local_27c[2] = (uint)local_19c.bigend.vect[2] >> 2;
      }
    }
    else if (iVar4 == 2) {
      if (local_19c.bigend.vect[2] < 0) {
        uVar18 = local_19c.bigend.vect[2] + 1;
        local_27c[2] = -uVar18;
        if (0 < (int)uVar18) {
          local_27c[2] = uVar18;
        }
        local_27c[2] = local_27c[2] >> 1;
        goto LAB_00756922;
      }
      local_27c[2] = (uint)local_19c.bigend.vect[2] >> 1;
    }
    else if (local_19c.bigend.vect[2] < 0) {
      iVar19 = local_19c.bigend.vect[2] + 1;
      iVar17 = -iVar19;
      if (0 < iVar19) {
        iVar17 = iVar19;
      }
      local_27c[2] = ~(iVar17 / iVar4);
    }
    else {
      local_27c[2] = local_19c.bigend.vect[2] / iVar4;
    }
  }
  local_27c[0] = local_27c[0] + (int)local_108[0]._vptr_BaseFab;
  local_27c[1] = local_27c[1] + local_108[0]._vptr_BaseFab._4_4_;
  local_27c[2] = local_27c[2] + (int)local_108[0].super_DataAllocator.m_arena;
LAB_00756a83:
  local_1c8 = (ulong)local_19c.btype.itype;
  uVar18 = local_27c[2];
  uVar15 = local_27c[0];
  uVar30 = local_288;
  uVar28 = local_27c[1];
  uVar24 = local_280;
  uVar44 = uStack_284;
  if ((uVar3 != 1 || uVar2 != 1) || (this->m_ratio).vect[2] != 1) {
    iVar4 = (this->m_ratio).vect[2];
    uVar28 = (uint)((local_19c.btype.itype & 2) == 0);
    uVar18 = (uint)((local_19c.btype.itype & 4) == 0);
    uVar18 = (local_27c[2] + uVar18) * iVar4 - uVar18;
    uVar15 = (local_27c[0] + (~local_19c.btype.itype & 1)) * uVar2 - (~local_19c.btype.itype & 1);
    uVar30 = local_288 * uVar2;
    uVar28 = (local_27c[1] + uVar28) * uVar3 - uVar28;
    uVar24 = local_280 * iVar4;
    uVar44 = uStack_284 * uVar3;
  }
  N = (this->m_cfpatch).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp;
  uVar26 = (ulong)N;
  uVar5 = (this->m_ratio).vect[2];
  uVar34 = (ulong)uVar5;
  dVar13 = (double)(int)(uVar5 * uVar3 * uVar2);
  auVar56._8_8_ = local_208._0_8_;
  auVar56._0_8_ = local_208._0_8_;
  auVar14._8_8_ = dVar13 * dx[1];
  auVar14._0_8_ = dVar13 * *dx;
  local_128 = divpd(auVar56,auVar14);
  local_118 = (double)local_208._0_8_ / (dVar13 * dx[2]);
  local_148[0] = a_flux->_M_elems[0];
  local_148[1] = a_flux->_M_elems[1];
  local_148[2] = a_flux->_M_elems[2];
  lVar45 = 0;
  do {
    FArrayBox::FArrayBox((FArrayBox *)((long)(&local_108[0].domain.smallend + -2) + lVar45));
    uVar54 = local_1c8;
    lVar45 = lVar45 + 0x48;
  } while (lVar45 != 0xd8);
  uVar43 = (uint)local_1c8;
  if ((((uVar30 != local_19c.smallend.vect[0]) || (uVar44 != local_19c.smallend.vect[1])) ||
      (uVar24 != local_19c.smallend.vect[2])) ||
     (((uVar15 != local_19c.bigend.vect[0] || (uVar28 != local_19c.bigend.vect[1])) ||
      ((uVar18 != local_19c.bigend.vect[2] || (uVar43 != local_19c.btype.itype)))))) {
    pBVar53 = local_108;
    lVar45 = 0;
    do {
      local_228.smallend.vect[0] = uVar30;
      local_228.smallend.vect[1] = uVar44;
      local_228.smallend.vect[2] = uVar24;
      local_228.bigend.vect[0] = uVar15;
      local_228.bigend.vect[1] = uVar28;
      local_228.bigend.vect[2] = uVar18;
      local_228.btype.itype = uVar43;
      if ((uVar43 >> ((uint)lVar45 & 0x1f) & 1) == 0) {
        piVar25 = local_228.bigend.vect + lVar45;
        *piVar25 = *piVar25 + 1;
        local_228.btype.itype = uVar43 | 1 << ((byte)lVar45 & 0x1f);
      }
      FArrayBox::resize((FArrayBox *)pBVar53,&local_228,N,(Arena *)0x0);
      local_260 = 0.0;
      BaseFab<double>::setVal<(amrex::RunOn)1>
                (pBVar53,(double *)&local_260,&pBVar53->domain,(DestComp)0x0,(NumComps)pBVar53->nvar
                );
      auVar1._0_12_ = *(undefined1 (*) [12])&(pBVar53->domain).bigend;
      auVar1._12_4_ = (pBVar53->domain).btype;
      auVar57 = auVar1._4_12_;
      bx_00.bigend.vect[0] =
           (int)((ulong)*(undefined8 *)((pBVar53->domain).smallend.vect + 2) >> 0x20);
      bx_00.smallend.vect = (int  [3])*(undefined1 (*) [12])(pBVar53->domain).smallend.vect;
      bx_00.bigend.vect[1] = auVar57._0_4_;
      bx_00.bigend.vect[2] = auVar57._4_4_;
      bx_00.btype.itype = auVar57._8_4_;
      BaseFab<double>::copy<(amrex::RunOn)1>
                (pBVar53,&a_flux->_M_elems[lVar45]->super_BaseFab<double>,bx_00,(SrcComp)0x0,
                 (DestComp)0x0,(NumComps)pBVar53->nvar);
      local_148[lVar45] = (FArrayBox *)pBVar53;
      lVar45 = lVar45 + 1;
      pBVar53 = pBVar53 + 1;
    } while (lVar45 != 3);
  }
  local_1e8 = (uint)(uVar54 >> 2) & 1;
  local_180 = CONCAT44((int)(uVar54 >> 1),uVar43) & 0x100000001;
  local_1c0 = *(pointer *)
               &pVVar10[iVar20].
                super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>;
  local_1b0 = *(pointer *)
               ((long)&pVVar10[iVar20].
                       super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> +
               8);
  lVar45 = 0;
  do {
    local_1f0 = lVar45;
    local_228.smallend.vect[2] = local_280;
    local_228.smallend.vect[0] = local_288;
    local_228.smallend.vect[1] = uStack_284;
    local_258 = local_27c[2];
    local_260 = (double)CONCAT44(local_27c[1],local_27c[0]);
    iVar20 = local_228.smallend.vect[local_1f0] + -1;
    local_228.smallend.vect[local_1f0] = iVar20;
    iVar19 = local_228.smallend.vect[2];
    iVar17 = local_228.smallend.vect[1];
    iVar4 = local_228.smallend.vect[0];
    *(int *)((long)&local_260 + local_1f0 * 4) = iVar20;
    uVar15 = local_258;
    local_250 = local_228.smallend.vect[0];
    local_254 = local_228.smallend.vect[1];
    local_24c = local_228.smallend.vect[2];
    iVar20 = (int)local_260;
    local_1cc = (int)local_260;
    uVar18 = local_260._4_4_;
    local_1d0 = local_260._4_4_;
    local_1d4 = local_258;
    local_228.smallend.vect[2] = local_280;
    local_258 = local_27c[2];
    local_260 = (double)CONCAT44(local_27c[1],local_27c[0]);
    local_158 = local_180;
    local_150 = local_1e8;
    iVar29 = (~*(uint *)((long)&local_158 + local_1f0 * 4) & 1) +
             *(int *)((long)&local_260 + local_1f0 * 4);
    local_228.smallend.vect[0] = local_288;
    local_228.smallend.vect[1] = uStack_284;
    local_228.smallend.vect[local_1f0] = iVar29;
    *(int *)((long)&local_260 + local_1f0 * 4) = iVar29;
    if (local_1c0 != local_1b0) {
      local_240 = local_228.smallend.vect[0];
      local_244 = local_228.smallend.vect[1];
      local_248 = local_228.smallend.vect[2];
      local_1d8 = (int)local_260;
      local_1dc = local_260._4_4_;
      local_1e0 = local_258;
      local_1b8 = local_148[local_1f0];
      uVar30 = (uint)local_1f0;
      local_1f4 = (uint)local_1c8 & ~(1 << (uVar30 & 0x1f));
      local_1e4 = uVar30 * 2 + 1;
      ppFVar16 = local_1c0;
      do {
        local_160 = ppFVar16;
        local_1a8 = *local_160;
        uVar28 = (local_1a8->super_BaseFab<double>).domain.smallend.vect[0];
        lVar45 = (long)(int)uVar28;
        uVar24 = uVar28;
        if ((int)uVar28 < iVar4) {
          uVar24 = iVar4;
        }
        uVar44 = *(int *)((long)&(local_1a8->super_BaseFab<double>).domain + 4);
        lVar35 = (long)(int)uVar44;
        uVar43 = uVar44;
        if ((int)uVar44 < iVar17) {
          uVar43 = iVar17;
        }
        uVar33 = *(int *)((long)&(local_1a8->super_BaseFab<double>).domain + 8);
        lVar36 = (long)(int)uVar33;
        uVar32 = uVar33;
        if ((int)uVar33 < iVar19) {
          uVar32 = iVar19;
        }
        local_23c = ((IntVect *)((long)&(local_1a8->super_BaseFab<double>).domain + 0xc))->vect[0];
        uVar6 = *(int *)((long)&(local_1a8->super_BaseFab<double>).domain + 0x10);
        iVar29 = local_23c;
        if (iVar20 < local_23c) {
          iVar29 = iVar20;
        }
        uVar21 = uVar6;
        if ((int)uVar18 < (int)uVar6) {
          uVar21 = uVar18;
        }
        uVar7 = *(int *)((long)&(local_1a8->super_BaseFab<double>).domain + 0x14);
        uVar23 = uVar7;
        if ((int)uVar15 < (int)uVar7) {
          uVar23 = uVar15;
        }
        if ((((int)uVar24 <= iVar29) && ((int)uVar43 <= (int)uVar21)) &&
           (((int)uVar32 <= (int)uVar23 && (local_1f4 < 8)))) {
          pdVar11 = (local_1a8->super_BaseFab<double>).dptr;
          lVar41 = (long)(int)((local_23c - uVar28) + 1);
          lVar46 = (int)((*(int *)((long)&(local_1a8->super_BaseFab<double>).domain + 0x10) - uVar44
                         ) + 1) * lVar41;
          local_230 = (double *)
                      ((int)((*(int *)((long)&(local_1a8->super_BaseFab<double>).domain + 0x14) -
                             uVar33) + 1) * lVar46);
          dVar13 = *(double *)(local_128 + local_1f0 * 8);
          pdVar12 = (local_1b8->super_BaseFab<double>).dptr;
          iVar40 = (local_1b8->super_BaseFab<double>).domain.smallend.vect[0];
          iVar8 = (local_1b8->super_BaseFab<double>).domain.smallend.vect[1];
          iVar9 = (local_1b8->super_BaseFab<double>).domain.smallend.vect[2];
          lVar37 = (long)(((local_1b8->super_BaseFab<double>).domain.bigend.vect[0] - iVar40) + 1);
          lVar47 = (((local_1b8->super_BaseFab<double>).domain.bigend.vect[1] - iVar8) + 1) * lVar37
          ;
          local_238 = (((local_1b8->super_BaseFab<double>).domain.bigend.vect[2] - iVar9) + 1) *
                      lVar47;
          if (uVar30 == 0) {
            if (0 < (int)N) {
              local_168 = pdVar11 + (int)(uVar24 - uVar28);
              local_170 = pdVar12 + (int)((uVar24 + 1) * uVar2 - iVar40);
              uVar24 = iVar17;
              if (iVar17 < (int)uVar44) {
                uVar24 = uVar44;
              }
              uVar22 = iVar19;
              if (iVar19 < (int)uVar33) {
                uVar22 = uVar33;
              }
              local_178 = (long)(int)uVar22;
              local_290 = 0;
              do {
                if ((int)uVar32 <= (int)uVar23) {
                  local_318 = local_178;
                  do {
                    if ((int)uVar43 <= (int)uVar21) {
                      lVar49 = (local_318 - lVar36) * lVar46;
                      lVar27 = (long)(int)uVar24;
                      iVar29 = uVar3 * uVar24 - iVar8;
                      do {
                        if (0 < (int)uVar5) {
                          lVar38 = (lVar27 - lVar35) * lVar41;
                          uVar54 = 0;
                          do {
                            if (0 < (int)uVar3) {
                              dVar55 = local_168[(long)local_230 * local_290 + lVar49 + lVar38];
                              uVar51 = uVar50;
                              iVar40 = iVar29;
                              do {
                                dVar55 = dVar55 - local_170[local_238 * local_290 +
                                                            (int)(((int)local_318 * uVar5 - iVar9) +
                                                                 (int)uVar54) * lVar47 +
                                                            iVar40 * lVar37] * dVar13;
                                local_168[(long)local_230 * local_290 + lVar49 + lVar38] = dVar55;
                                iVar40 = iVar40 + 1;
                                uVar51 = uVar51 - 1;
                              } while (uVar51 != 0);
                            }
                            uVar54 = uVar54 + 1;
                          } while (uVar54 != uVar34);
                        }
                        lVar27 = lVar27 + 1;
                        iVar29 = iVar29 + uVar3;
                      } while (((uVar21 + uVar24) - uVar43) + 1 != (int)lVar27);
                    }
                    local_318 = local_318 + 1;
                  } while (((uVar23 + uVar22) - uVar32) + 1 != (int)local_318);
                }
                local_290 = local_290 + 1;
              } while (local_290 != uVar26);
            }
          }
          else if (uVar30 == 2) {
            if (0 < (int)N) {
              lVar46 = lVar46 * (int)(uVar32 - uVar33);
              uVar23 = iVar4;
              if (iVar4 < (int)uVar28) {
                uVar23 = uVar28;
              }
              uVar22 = iVar17;
              if (iVar17 < (int)uVar44) {
                uVar22 = uVar44;
              }
              local_2f0 = 0;
              do {
                if ((int)uVar43 <= (int)uVar21) {
                  lVar27 = (long)(int)uVar22;
                  do {
                    if ((int)uVar24 <= iVar29) {
                      lVar38 = (lVar27 - lVar35) * lVar41;
                      lVar49 = (long)(int)uVar23;
                      iVar39 = uVar2 * uVar23 - iVar40;
                      do {
                        if (0 < (int)uVar3) {
                          uVar54 = 0;
                          do {
                            if (0 < (int)uVar2) {
                              dVar55 = pdVar11[lVar46 + (long)local_230 * local_2f0 +
                                                        lVar38 + (lVar49 - lVar45)];
                              uVar51 = uVar52;
                              iVar31 = iVar39;
                              do {
                                dVar55 = dVar55 - pdVar12[lVar47 * (int)((uVar32 + 1) * uVar5 -
                                                                        iVar9) +
                                                          local_238 * local_2f0 +
                                                          (int)(((int)lVar27 * uVar3 - iVar8) +
                                                               (int)uVar54) * lVar37 + (long)iVar31]
                                                  * dVar13;
                                pdVar11[lVar46 + (long)local_230 * local_2f0 +
                                                 lVar38 + (lVar49 - lVar45)] = dVar55;
                                iVar31 = iVar31 + 1;
                                uVar51 = uVar51 - 1;
                              } while (uVar51 != 0);
                            }
                            uVar54 = uVar54 + 1;
                          } while (uVar54 != uVar50);
                        }
                        lVar49 = lVar49 + 1;
                        iVar39 = iVar39 + uVar2;
                      } while (((iVar29 + uVar23) - uVar24) + 1 != (int)lVar49);
                    }
                    lVar27 = lVar27 + 1;
                  } while (((uVar21 + uVar22) - uVar43) + 1 != (int)lVar27);
                }
                local_2f0 = local_2f0 + 1;
              } while (local_2f0 != uVar26);
            }
          }
          else if (uVar30 == 1) {
            if (0 < (int)N) {
              lVar41 = lVar41 * (int)(uVar43 - uVar44);
              uVar21 = iVar4;
              if (iVar4 < (int)uVar28) {
                uVar21 = uVar28;
              }
              uVar22 = iVar19;
              if (iVar19 < (int)uVar33) {
                uVar22 = uVar33;
              }
              local_2d8 = 0;
              do {
                if ((int)uVar32 <= (int)uVar23) {
                  lVar27 = (long)(int)uVar22;
                  do {
                    if ((int)uVar24 <= iVar29) {
                      lVar38 = (lVar27 - lVar36) * lVar46;
                      lVar49 = (long)(int)uVar21;
                      iVar39 = uVar2 * uVar21 - iVar40;
                      do {
                        if (0 < (int)uVar5) {
                          uVar54 = 0;
                          do {
                            if (0 < (int)uVar2) {
                              dVar55 = pdVar11[lVar41 + (long)local_230 * local_2d8 +
                                                        lVar38 + (lVar49 - lVar45)];
                              uVar51 = uVar52;
                              iVar31 = iVar39;
                              do {
                                dVar55 = dVar55 - pdVar12[lVar37 * (int)((uVar43 + 1) * uVar3 -
                                                                        iVar8) +
                                                          local_238 * local_2d8 +
                                                          (int)(((int)lVar27 * uVar5 - iVar9) +
                                                               (int)uVar54) * lVar47 + (long)iVar31]
                                                  * dVar13;
                                pdVar11[lVar41 + (long)local_230 * local_2d8 +
                                                 lVar38 + (lVar49 - lVar45)] = dVar55;
                                iVar31 = iVar31 + 1;
                                uVar51 = uVar51 - 1;
                              } while (uVar51 != 0);
                            }
                            uVar54 = uVar54 + 1;
                          } while (uVar54 != uVar34);
                        }
                        lVar49 = lVar49 + 1;
                        iVar39 = iVar39 + uVar2;
                      } while (((iVar29 + uVar21) - uVar24) + 1 != (int)lVar49);
                    }
                    lVar27 = lVar27 + 1;
                  } while (((uVar23 + uVar22) - uVar32) + 1 != (int)lVar27);
                }
                local_2d8 = local_2d8 + 1;
              } while (local_2d8 != uVar26);
            }
          }
          else if (0 < (int)N) {
            lVar46 = lVar46 * (int)(uVar32 - uVar33);
            uVar23 = iVar4;
            if (iVar4 < (int)uVar28) {
              uVar23 = uVar28;
            }
            uVar22 = iVar17;
            if (iVar17 < (int)uVar44) {
              uVar22 = uVar44;
            }
            local_2f0 = 0;
            do {
              if ((int)uVar43 <= (int)uVar21) {
                lVar27 = (long)(int)uVar22;
                do {
                  if ((int)uVar24 <= iVar29) {
                    lVar38 = (lVar27 - lVar35) * lVar41;
                    lVar49 = (long)(int)uVar23;
                    iVar39 = uVar2 * uVar23 - iVar40;
                    do {
                      if (0 < (int)uVar3) {
                        uVar54 = 0;
                        do {
                          if (0 < (int)uVar2) {
                            dVar55 = pdVar11[lVar46 + (long)local_230 * local_2f0 +
                                                      lVar38 + (lVar49 - lVar45)];
                            uVar51 = uVar52;
                            iVar31 = iVar39;
                            do {
                              dVar55 = dVar55 + pdVar12[lVar47 * (int)(uVar32 * uVar5 - iVar9) +
                                                        local_238 * local_2f0 +
                                                        (int)(((int)lVar27 * uVar3 - iVar8) +
                                                             (int)uVar54) * lVar37 + (long)iVar31] *
                                                dVar13;
                              pdVar11[lVar46 + (long)local_230 * local_2f0 +
                                               lVar38 + (lVar49 - lVar45)] = dVar55;
                              iVar31 = iVar31 + 1;
                              uVar51 = uVar51 - 1;
                            } while (uVar51 != 0);
                          }
                          uVar54 = uVar54 + 1;
                        } while (uVar54 != uVar50);
                      }
                      lVar49 = lVar49 + 1;
                      iVar39 = iVar39 + uVar2;
                    } while (((iVar29 + uVar23) - uVar24) + 1 != (int)lVar49);
                  }
                  lVar27 = lVar27 + 1;
                } while (((uVar21 + uVar22) - uVar43) + 1 != (int)lVar27);
              }
              local_2f0 = local_2f0 + 1;
            } while (local_2f0 != uVar26);
          }
        }
        uVar24 = uVar28;
        if ((int)uVar28 < local_228.smallend.vect[0]) {
          uVar24 = local_228.smallend.vect[0];
        }
        uVar43 = uVar44;
        if ((int)uVar44 < local_228.smallend.vect[1]) {
          uVar43 = local_228.smallend.vect[1];
        }
        uVar32 = uVar33;
        if ((int)uVar33 < local_228.smallend.vect[2]) {
          uVar32 = local_228.smallend.vect[2];
        }
        iVar29 = local_23c;
        if ((int)local_260 < local_23c) {
          iVar29 = (int)local_260;
        }
        if ((int)local_260._4_4_ < (int)uVar6) {
          uVar6 = local_260._4_4_;
        }
        local_208._4_4_ = 0;
        local_208._0_4_ = uVar6;
        if ((int)local_258 < (int)uVar7) {
          uVar7 = local_258;
        }
        local_268 = (ulong)uVar7;
        if (((((int)uVar24 <= iVar29) && ((int)uVar43 <= (int)uVar6)) && ((int)uVar32 <= (int)uVar7)
            ) && (local_1f4 < 8)) {
          pdVar11 = (local_1a8->super_BaseFab<double>).dptr;
          lVar47 = (long)(int)((local_23c - uVar28) + 1);
          lVar49 = (int)((*(int *)((long)&(local_1a8->super_BaseFab<double>).domain + 0x10) - uVar44
                         ) + 1) * lVar47;
          lVar37 = (int)((*(int *)((long)&(local_1a8->super_BaseFab<double>).domain + 0x14) - uVar33
                         ) + 1) * lVar49;
          dVar13 = *(double *)(local_128 + local_1f0 * 8);
          pdVar12 = (local_1b8->super_BaseFab<double>).dptr;
          iVar40 = (local_1b8->super_BaseFab<double>).domain.smallend.vect[0];
          iVar8 = (local_1b8->super_BaseFab<double>).domain.smallend.vect[1];
          iVar9 = (local_1b8->super_BaseFab<double>).domain.smallend.vect[2];
          lVar41 = (long)(((local_1b8->super_BaseFab<double>).domain.bigend.vect[0] - iVar40) + 1);
          lVar46 = (((local_1b8->super_BaseFab<double>).domain.bigend.vect[1] - iVar8) + 1) * lVar41
          ;
          lVar27 = (((local_1b8->super_BaseFab<double>).domain.bigend.vect[2] - iVar9) + 1) * lVar46
          ;
          if (local_1e4 == 3) {
            if (0 < (int)N) {
              lVar47 = lVar47 * (int)(uVar43 - uVar44);
              uVar44 = local_228.smallend.vect[0];
              if (local_228.smallend.vect[0] < (int)uVar28) {
                uVar44 = uVar28;
              }
              uVar28 = local_228.smallend.vect[2];
              if (local_228.smallend.vect[2] < (int)uVar33) {
                uVar28 = uVar33;
              }
              local_208._0_8_ = (long)(int)uVar44;
              local_2e0 = 0;
              do {
                if ((int)uVar32 <= (int)uVar7) {
                  lVar35 = (long)(int)uVar28;
                  do {
                    if ((int)uVar24 <= iVar29) {
                      lVar42 = (lVar35 - lVar36) * lVar49;
                      lVar38 = (long)(int)uVar44;
                      iVar39 = uVar2 * uVar44 - iVar40;
                      do {
                        if (0 < (int)uVar5) {
                          uVar54 = 0;
                          do {
                            if (0 < (int)uVar2) {
                              dVar55 = pdVar11[lVar47 + lVar37 * local_2e0 +
                                                        lVar42 + (lVar38 - lVar45)];
                              uVar51 = uVar52;
                              iVar31 = iVar39;
                              do {
                                dVar55 = dVar55 + pdVar12[lVar41 * (int)(uVar43 * uVar3 - iVar8) +
                                                          lVar27 * local_2e0 +
                                                          (int)(((int)lVar35 * uVar5 - iVar9) +
                                                               (int)uVar54) * lVar46 + (long)iVar31]
                                                  * dVar13;
                                pdVar11[lVar47 + lVar37 * local_2e0 + lVar42 + (lVar38 - lVar45)] =
                                     dVar55;
                                iVar31 = iVar31 + 1;
                                uVar51 = uVar51 - 1;
                              } while (uVar51 != 0);
                            }
                            uVar54 = uVar54 + 1;
                          } while (uVar54 != uVar34);
                        }
                        lVar38 = lVar38 + 1;
                        iVar39 = iVar39 + uVar2;
                      } while (((iVar29 + uVar44) - uVar24) + 1 != (int)lVar38);
                    }
                    lVar35 = lVar35 + 1;
                  } while (((uVar7 + uVar28) - uVar32) + 1 != (int)lVar35);
                }
                local_2e0 = local_2e0 + 1;
              } while (local_2e0 != uVar26);
            }
          }
          else if (local_1e4 == 1) {
            if (0 < (int)N) {
              local_230 = pdVar12 + (int)(uVar24 * uVar2 - iVar40);
              uVar21 = local_228.smallend.vect[1];
              if (local_228.smallend.vect[1] < (int)uVar44) {
                uVar21 = uVar44;
              }
              uVar44 = local_228.smallend.vect[2];
              if (local_228.smallend.vect[2] < (int)uVar33) {
                uVar44 = uVar33;
              }
              local_238 = (long)(int)uVar44;
              local_2f0 = 0;
              do {
                if ((int)uVar32 <= (int)uVar7) {
                  local_300 = local_238;
                  do {
                    if ((int)uVar43 <= (int)uVar6) {
                      lVar38 = (local_300 - lVar36) * lVar49;
                      lVar45 = (long)(int)uVar21;
                      iVar29 = uVar3 * uVar21 - iVar8;
                      do {
                        if (0 < (int)uVar5) {
                          lVar42 = (lVar45 - lVar35) * lVar47;
                          uVar54 = 0;
                          do {
                            if (0 < (int)uVar3) {
                              dVar55 = pdVar11[(long)(int)(uVar24 - uVar28) +
                                               lVar37 * local_2f0 + lVar38 + lVar42];
                              uVar51 = uVar50;
                              iVar40 = iVar29;
                              do {
                                dVar55 = dVar55 + local_230[lVar27 * local_2f0 +
                                                            (int)(((int)local_300 * uVar5 - iVar9) +
                                                                 (int)uVar54) * lVar46 +
                                                            iVar40 * lVar41] * dVar13;
                                pdVar11[(long)(int)(uVar24 - uVar28) +
                                        lVar37 * local_2f0 + lVar38 + lVar42] = dVar55;
                                iVar40 = iVar40 + 1;
                                uVar51 = uVar51 - 1;
                              } while (uVar51 != 0);
                            }
                            uVar54 = uVar54 + 1;
                          } while (uVar54 != uVar34);
                        }
                        lVar45 = lVar45 + 1;
                        iVar29 = iVar29 + uVar3;
                      } while (((uVar6 + uVar21) - uVar43) + 1 != (int)lVar45);
                    }
                    local_300 = local_300 + 1;
                  } while (((uVar7 + uVar44) - uVar32) + 1 != (int)local_300);
                }
                local_2f0 = local_2f0 + 1;
              } while (local_2f0 != uVar26);
            }
          }
          else if (0 < (int)N) {
            lVar49 = lVar49 * (int)(uVar32 - uVar33);
            uVar33 = local_228.smallend.vect[0];
            if (local_228.smallend.vect[0] < (int)uVar28) {
              uVar33 = uVar28;
            }
            uVar28 = local_228.smallend.vect[1];
            if (local_228.smallend.vect[1] < (int)uVar44) {
              uVar28 = uVar44;
            }
            local_268 = (ulong)(int)uVar28;
            local_2d8 = 0;
            do {
              if ((int)uVar43 <= (int)uVar6) {
                uVar54 = local_268;
                do {
                  if ((int)uVar24 <= iVar29) {
                    lVar38 = (uVar54 - lVar35) * lVar47;
                    lVar36 = (long)(int)uVar33;
                    iVar39 = uVar2 * uVar33 - iVar40;
                    do {
                      if (0 < (int)uVar3) {
                        uVar51 = 0;
                        do {
                          if (0 < (int)uVar2) {
                            dVar55 = pdVar11[lVar49 + lVar37 * local_2d8 +
                                                      lVar38 + (lVar36 - lVar45)];
                            uVar48 = uVar52;
                            iVar31 = iVar39;
                            do {
                              dVar55 = dVar55 + pdVar12[lVar46 * (int)(uVar32 * uVar5 - iVar9) +
                                                        lVar27 * local_2d8 +
                                                        (int)(((int)uVar54 * uVar3 - iVar8) +
                                                             (int)uVar51) * lVar41 + (long)iVar31] *
                                                dVar13;
                              pdVar11[lVar49 + lVar37 * local_2d8 + lVar38 + (lVar36 - lVar45)] =
                                   dVar55;
                              iVar31 = iVar31 + 1;
                              uVar48 = uVar48 - 1;
                            } while (uVar48 != 0);
                          }
                          uVar51 = uVar51 + 1;
                        } while (uVar51 != uVar50);
                      }
                      lVar36 = lVar36 + 1;
                      iVar39 = iVar39 + uVar2;
                    } while (((iVar29 + uVar33) - uVar24) + 1 != (int)lVar36);
                  }
                  uVar54 = uVar54 + 1;
                } while (((uVar6 + uVar28) - uVar43) + 1 != (int)uVar54);
              }
              local_2d8 = local_2d8 + 1;
            } while (local_2d8 != uVar26);
          }
        }
        ppFVar16 = local_160 + 1;
      } while (local_160 + 1 != local_1b0);
    }
    lVar45 = local_1f0 + 1;
  } while (local_1f0 + 1 != 3);
  lVar45 = 0x90;
  do {
    pBVar53 = (BaseFab<double> *)((long)(&local_108[0].domain.smallend + -2) + lVar45);
    pBVar53->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
    BaseFab<double>::clear(pBVar53);
    lVar45 = lVar45 + -0x48;
  } while (lVar45 != -0x48);
  return;
}

Assistant:

void
YAFluxRegister::FineAdd (const MFIter& mfi,
                         const std::array<FArrayBox const*, AMREX_SPACEDIM>& a_flux,
                         const Real* dx, Real dt, RunOn runon) noexcept
{
    BL_ASSERT(m_cfpatch.nComp() == a_flux[0]->nComp());

    const int li = mfi.LocalIndex();
    Vector<FArrayBox*>& cfp_fabs = m_cfp_fab[li];
    if (cfp_fabs.empty()) return;

    const Box& tbx = mfi.tilebox();
    const Box& bx = amrex::coarsen(tbx, m_ratio);
    const Box& fbx = amrex::refine(bx, m_ratio);
    const int nc = m_cfpatch.nComp();

    const Real ratio = static_cast<Real>(AMREX_D_TERM(m_ratio[0],*m_ratio[1],*m_ratio[2]));
    std::array<Real,AMREX_SPACEDIM> dtdx{{AMREX_D_DECL(dt/(dx[0]*ratio),
                                                       dt/(dx[1]*ratio),
                                                       dt/(dx[2]*ratio))}};
    const Dim3 rr = m_ratio.dim3();

    std::array<FArrayBox const*,AMREX_SPACEDIM> flux{{AMREX_D_DECL(a_flux[0],a_flux[1],a_flux[2])}};
    bool use_gpu = (runon == RunOn::Gpu) && Gpu::inLaunchRegion();
    amrex::ignore_unused(use_gpu);
    std::array<FArrayBox,AMREX_SPACEDIM> ftmp;
    if (fbx != tbx) {
        AMREX_ASSERT(!use_gpu);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            const Box& b = amrex::surroundingNodes(fbx,idim);
            ftmp[idim].resize(b,nc);
            ftmp[idim].setVal<RunOn::Host>(0.0);
            ftmp[idim].copy<RunOn::Host>(*a_flux[idim]);
            flux[idim] = &ftmp[idim];
        }
    }

    AMREX_ASSERT(bx.cellCentered());

    for (int idim=0; idim < AMREX_SPACEDIM; ++idim)
    {
        const Box& lobx = amrex::adjCellLo(bx, idim);
        const Box& hibx = amrex::adjCellHi(bx, idim);
        FArrayBox const* f = flux[idim];
        for (FArrayBox* cfp : cfp_fabs)
        {
            {
                const Box& lobx_is = lobx & cfp->box();
                const int side = 0;
                if (lobx_is.ok())
                {
                    auto d = cfp->array();
                    Real dtdxs = dtdx[idim];
                    int dirside = idim*2+side;
                    Array4<Real const> farr = f->const_array();
                    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG(runon, lobx_is, tmpbox,
                    {
                        yafluxreg_fineadd(tmpbox, d, farr, dtdxs, nc, dirside, rr);
                    });
                }
            }
            {
                const Box& hibx_is = hibx & cfp->box();
                const int side = 1;
                if (hibx_is.ok())
                {
                    auto d = cfp->array();
                    Real dtdxs = dtdx[idim];
                    int dirside = idim*2+side;
                    Array4<Real const> farr = f->const_array();
                    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG(runon, hibx_is, tmpbox,
                    {
                        yafluxreg_fineadd(tmpbox, d, farr, dtdxs, nc, dirside, rr);
                    });
                }
            }
        }
    }
}